

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

void DoRemap(WebPIDecoder *idec,ptrdiff_t offset)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  uint32_t p;
  uint uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  
  pvVar2 = idec->dec_;
  sVar4 = (idec->mem_).start_;
  puVar8 = (idec->mem_).buf_ + sVar4;
  (idec->io_).data = puVar8;
  sVar4 = (idec->mem_).end_ - sVar4;
  (idec->io_).data_size = sVar4;
  if (pvVar2 != (void *)0x0) {
    if (idec->is_lossless_ != 0) {
LAB_00109804:
      VP8LBitReaderSetBuffer((VP8LBitReader *)((long)pvVar2 + 0x28),puVar8,sVar4);
      return;
    }
    uVar1 = *(uint *)((long)pvVar2 + 0x1b0);
    if (offset != 0) {
      uVar7 = 0;
      do {
        VP8RemapBitReader((VP8BitReader *)((long)pvVar2 + uVar7 * 0x30 + 0x1b8),offset);
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
      } while (uVar6 <= uVar1);
      if ((idec->mem_).mode_ == MEM_MODE_MAP) {
        VP8RemapBitReader((VP8BitReader *)((long)pvVar2 + 0x10),offset);
      }
    }
    puVar8 = *(uint8_t **)((long)pvVar2 + (ulong)uVar1 * 0x30 + 0x1c8);
    VP8BitReaderSetBuffer
              ((VP8BitReader *)((long)pvVar2 + (ulong)uVar1 * 0x30 + 0x1b8),puVar8,
               (size_t)((idec->mem_).buf_ + ((idec->mem_).end_ - (long)puVar8)));
    if ((((idec->state_ != STATE_WEBP_HEADER) && (idec->is_lossless_ == 0)) &&
        (*(long *)((long)idec->dec_ + 0xb98) != 0)) && (*(int *)((long)idec->dec_ + 0xba8) == 0)) {
      lVar3 = *(long *)((long)pvVar2 + 0xb90);
      lVar5 = offset + *(long *)((long)pvVar2 + 0xb98);
      *(long *)((long)pvVar2 + 0xb98) = lVar5;
      if (((lVar3 != 0) && (*(void **)(lVar3 + 0x18) != (void *)0x0)) && (*(int *)(lVar3 + 8) == 1))
      {
        puVar8 = (uint8_t *)(lVar5 + 1);
        sVar4 = *(long *)((long)pvVar2 + 0xba0) - 1;
        pvVar2 = *(void **)(lVar3 + 0x18);
        goto LAB_00109804;
      }
    }
  }
  return;
}

Assistant:

static void DoRemap(WebPIDecoder* const idec, ptrdiff_t offset) {
  MemBuffer* const mem = &idec->mem_;
  const uint8_t* const new_base = mem->buf_ + mem->start_;
  // note: for VP8, setting up idec->io_ is only really needed at the beginning
  // of the decoding, till partition #0 is complete.
  idec->io_.data = new_base;
  idec->io_.data_size = MemDataSize(mem);

  if (idec->dec_ != NULL) {
    if (!idec->is_lossless_) {
      VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
      const uint32_t last_part = dec->num_parts_minus_one_;
      if (offset != 0) {
        uint32_t p;
        for (p = 0; p <= last_part; ++p) {
          VP8RemapBitReader(dec->parts_ + p, offset);
        }
        // Remap partition #0 data pointer to new offset, but only in MAP
        // mode (in APPEND mode, partition #0 is copied into a fixed memory).
        if (mem->mode_ == MEM_MODE_MAP) {
          VP8RemapBitReader(&dec->br_, offset);
        }
      }
      {
        const uint8_t* const last_start = dec->parts_[last_part].buf_;
        VP8BitReaderSetBuffer(&dec->parts_[last_part], last_start,
                              mem->buf_ + mem->end_ - last_start);
      }
      if (NeedCompressedAlpha(idec)) {
        ALPHDecoder* const alph_dec = dec->alph_dec_;
        dec->alpha_data_ += offset;
        if (alph_dec != NULL && alph_dec->vp8l_dec_ != NULL) {
          if (alph_dec->method_ == ALPHA_LOSSLESS_COMPRESSION) {
            VP8LDecoder* const alph_vp8l_dec = alph_dec->vp8l_dec_;
            assert(dec->alpha_data_size_ >= ALPHA_HEADER_LEN);
            VP8LBitReaderSetBuffer(&alph_vp8l_dec->br_,
                                   dec->alpha_data_ + ALPHA_HEADER_LEN,
                                   dec->alpha_data_size_ - ALPHA_HEADER_LEN);
          } else {  // alph_dec->method_ == ALPHA_NO_COMPRESSION
            // Nothing special to do in this case.
          }
        }
      }
    } else {    // Resize lossless bitreader
      VP8LDecoder* const dec = (VP8LDecoder*)idec->dec_;
      VP8LBitReaderSetBuffer(&dec->br_, new_base, MemDataSize(mem));
    }
  }
}